

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxer.cc
# Opt level: O0

bool __thiscall mkvmuxer::Chapters::Write(Chapters *this,IMkvWriter *writer)

{
  bool bVar1;
  uint64_t uVar2;
  long lVar3;
  uint64_t uVar4;
  long lVar5;
  long *in_RSI;
  uint64 in_RDI;
  int64_t stop;
  int64_t start;
  uint64_t payload_size;
  uint64 in_stack_ffffffffffffffd0;
  IMkvWriter *in_stack_ffffffffffffffd8;
  undefined1 local_1;
  
  if (in_RSI == (long *)0x0) {
    local_1 = false;
  }
  else {
    uVar2 = WriteEdition((Chapters *)payload_size,(IMkvWriter *)start);
    bVar1 = WriteEbmlMasterElement(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0,in_RDI);
    if (bVar1) {
      lVar3 = (**(code **)(*in_RSI + 8))();
      uVar4 = WriteEdition((Chapters *)payload_size,(IMkvWriter *)start);
      if (uVar4 == 0) {
        local_1 = false;
      }
      else {
        lVar5 = (**(code **)(*in_RSI + 8))();
        if ((lVar5 < lVar3) || (lVar5 - lVar3 == uVar2)) {
          local_1 = true;
        }
        else {
          local_1 = false;
        }
      }
    }
    else {
      local_1 = false;
    }
  }
  return local_1;
}

Assistant:

bool Chapters::Write(IMkvWriter* writer) const {
  if (writer == NULL)
    return false;

  const uint64_t payload_size = WriteEdition(NULL);  // return size only

  if (!WriteEbmlMasterElement(writer, libwebm::kMkvChapters, payload_size))
    return false;

  const int64_t start = writer->Position();

  if (WriteEdition(writer) == 0)  // error
    return false;

  const int64_t stop = writer->Position();

  if (stop >= start && uint64_t(stop - start) != payload_size)
    return false;

  return true;
}